

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::PPlot::DrawYTick
          (PPlot *this,float inY,int inScreenX,bool inMajor,string *inFormatString,
          Painter *inPainter,PRect *outRect)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *__format;
  int extraout_var;
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 uVar4;
  int theHalfFontHeight;
  int theStringWidth;
  float theScreenY;
  int theTickSize;
  char theBuf [128];
  PRect *outRect_local;
  Painter *inPainter_local;
  string *inFormatString_local;
  bool inMajor_local;
  int inScreenX_local;
  float inY_local;
  PPlot *this_local;
  
  theBuf._120_8_ = outRect;
  (*this->mYTrafo->_vptr_Trafo[2])((ulong)(uint)inY);
  fVar3 = (float)extraout_XMM0_Qa;
  *(long *)theBuf._120_8_ = (long)inScreenX;
  *(long *)(theBuf._120_8_ + 8) = (long)fVar3;
  *(undefined8 *)(theBuf._120_8_ + 0x10) = 0;
  *(undefined8 *)(theBuf._120_8_ + 0x18) = 0;
  if (inMajor) {
    theStringWidth = (this->mYAxisSetup).mTickInfo.mMajorTickScreenSize;
    __format = (char *)std::__cxx11::string::c_str();
    snprintf((char *)&theScreenY,0x80,__format,(double)inY);
    iVar2 = (*inPainter->_vptr_Painter[8])(inPainter,&theScreenY);
    *(long *)theBuf._120_8_ =
         *(long *)theBuf._120_8_ -
         (long)(iVar2 + theStringWidth + (this->mYAxisSetup).mTickInfo.mMinorTickScreenSize);
    iVar2 = (*inPainter->_vptr_Painter[9])();
    auVar1._4_4_ = extraout_var;
    auVar1._0_4_ = iVar2;
    auVar1._8_8_ = (long)extraout_var >> 0x1f;
    (*inPainter->_vptr_Painter[10])
              (inPainter,*(ulong *)theBuf._120_8_ & 0xffffffff,
               (ulong)(uint)(int)(fVar3 + (float)SUB164(auVar1 / SEXT816(2),0)),&theScreenY);
    uVar4 = extraout_XMM0_Qa_00;
  }
  else {
    theStringWidth = (this->mYAxisSetup).mTickInfo.mMinorTickScreenSize;
    *(long *)theBuf._120_8_ = *(long *)theBuf._120_8_ - (long)theStringWidth;
    uVar4 = extraout_XMM0_Qa;
  }
  (**inPainter->_vptr_Painter)
            (CONCAT44((int)((ulong)uVar4 >> 0x20),(float)inScreenX),fVar3,
             (float)(inScreenX - theStringWidth),fVar3);
  return true;
}

Assistant:

bool PPlot::DrawYTick (float inY, int inScreenX, bool inMajor, const string &inFormatString, Painter &inPainter, PRect &outRect) const {
      char theBuf[128];
      int theTickSize;
      float theScreenY = mYTrafo->Transform(inY);
      outRect.mX = inScreenX;
      outRect.mY = theScreenY;
      outRect.mW = 0;// not used
      outRect.mH = 0;// not used
      if (inMajor) {
        theTickSize = mYAxisSetup.mTickInfo.mMajorTickScreenSize;
        snprintf (theBuf, 128, inFormatString.c_str (), inY);
        int theStringWidth = inPainter.CalculateTextDrawSize (theBuf);
        outRect.mX -= (theStringWidth+theTickSize+mYAxisSetup.mTickInfo.mMinorTickScreenSize);
        int theHalfFontHeight = inPainter.GetFontHeight ()/2;// for sort of vertical centralizing
        inPainter.DrawText (outRect.mX, theScreenY+theHalfFontHeight, theBuf);

      }
      else {
        theTickSize = mYAxisSetup.mTickInfo.mMinorTickScreenSize;
        outRect.mX -= theTickSize;
      }

      inPainter.DrawLine (inScreenX, theScreenY, inScreenX-theTickSize, theScreenY);
      return true;
    }